

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.hpp
# Opt level: O0

string * cs_impl::to_string<cs::range_type>(range_type *range)

{
  bool bVar1;
  range_iterator *in_RDI;
  numeric it;
  range_iterator __end1;
  range_iterator __begin1;
  range_type *__range1;
  string str;
  range_iterator *in_stack_fffffffffffffe98;
  undefined1 *puVar2;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  range_iterator *this;
  string local_138 [32];
  string local_118 [16];
  range_type *in_stack_fffffffffffffef8;
  undefined1 local_49 [56];
  allocator local_11 [17];
  
  this = in_RDI;
  bVar1 = cs::range_type::empty((range_type *)0x538d41);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"cs::range => {}",local_11);
    std::allocator<char>::~allocator((allocator<char> *)local_11);
  }
  else {
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_49;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_49 + 1),"cs::range => {",(allocator *)__lhs);
    std::allocator<char>::~allocator((allocator<char> *)local_49);
    cs::range_type::begin(in_stack_fffffffffffffef8);
    cs::range_type::end(in_stack_fffffffffffffef8);
    while( true ) {
      in_stack_fffffffffffffea7 =
           cs::range_iterator::operator!=
                     ((range_iterator *)
                      CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                      in_stack_fffffffffffffe98);
      if (!(bool)in_stack_fffffffffffffea7) break;
      cs::range_iterator::operator*(in_stack_fffffffffffffe98);
      to_string<cs::numeric>((numeric *)it._24_8_);
      std::operator+(__lhs,(char *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
      std::__cxx11::string::operator+=((string *)(local_49 + 1),local_118);
      std::__cxx11::string::~string(local_118);
      std::__cxx11::string::~string(local_138);
      cs::range_iterator::operator++(this);
    }
    puVar2 = local_49 + 1;
    std::__cxx11::string::size();
    std::__cxx11::string::resize((ulong)puVar2);
    std::__cxx11::string::operator+=((string *)(local_49 + 1),"}");
    std::__cxx11::string::string((string *)in_RDI,(string *)(local_49 + 1));
    std::__cxx11::string::~string((string *)(local_49 + 1));
  }
  return (string *)this;
}

Assistant:

std::string to_string<cs::range_type>(const cs::range_type &range)
	{
		if (range.empty())
			return "cs::range => {}";
		std::string str = "cs::range => {";
		for (cs::numeric it: range)
			str += to_string(it) + ", ";
		str.resize(str.size() - 2);
		str += "}";
		return std::move(str);
	}